

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColorPicker.cpp
# Opt level: O1

void __thiscall gui::ColorPicker::draw(ColorPicker *this,RenderTarget *target,RenderStates states)

{
  Widget *this_00;
  element_type *peVar1;
  pointer psVar2;
  bool bVar3;
  Transform *right;
  vector<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_> *pvVar4;
  shared_ptr<gui::Widget> *child;
  pointer psVar5;
  Vector2f VVar6;
  Color local_2c;
  
  this_00 = &(this->super_Group).super_Container.super_Widget;
  bVar3 = Widget::isVisible(this_00);
  if (bVar3) {
    right = Widget::getTransform(this_00);
    sf::operator*=(&states.transform,right);
    sf::RenderTarget::draw(target,&(this->shadingRectangle_).super_Drawable,&states);
    VVar6 = getShadingRectangleSize(this);
    sf::Transformable::setPosition
              (&(((this->style_).
                  super___shared_ptr<gui::ColorPickerStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                dot_).super_Shape.super_Transformable,
               (this->currentColorHsva_)._M_elems[1] * VVar6.x,
               (1.0 - (this->currentColorHsva_)._M_elems[2]) * VVar6.y);
    peVar1 = (this->style_).super___shared_ptr<gui::ColorPickerStyle,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    sf::Color::Color(&local_2c,(this->roundedColorRgba_).r,(this->roundedColorRgba_).g,
                     (this->roundedColorRgba_).b,0xff);
    sf::Shape::setFillColor(&(peVar1->dot_).super_Shape,&local_2c);
    sf::RenderTarget::draw
              (target,(Drawable *)
                      &((this->style_).
                        super___shared_ptr<gui::ColorPickerStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                       )->dot_,&states);
    sf::RenderTarget::draw(target,&(this->hueBar_).super_Drawable,&states);
    states.texture = &this->alphaTexture_;
    sf::RenderTarget::draw(target,&(this->alphaBar_).super_Drawable,&states);
    states.texture = (Texture *)0x0;
    pvVar4 = ContainerBase::getChildren((ContainerBase *)this);
    psVar2 = (pvVar4->
             super__Vector_base<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (psVar5 = (pvVar4->
                  super__Vector_base<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>
                  )._M_impl.super__Vector_impl_data._M_start; psVar5 != psVar2; psVar5 = psVar5 + 1)
    {
      sf::RenderTarget::draw
                (target,&((psVar5->super___shared_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr)->super_Drawable,&states);
    }
  }
  return;
}

Assistant:

void ColorPicker::draw(sf::RenderTarget& target, sf::RenderStates states) const {
    if (!isVisible()) {
        return;
    }
    states.transform *= getTransform();

    target.draw(shadingRectangle_, states);
    const sf::Vector2f shadingRectangleSize = getShadingRectangleSize();
    style_->dot_.setPosition(currentColorHsva_[1] * shadingRectangleSize.x, (1.0f - currentColorHsva_[2]) * shadingRectangleSize.y);
    style_->dot_.setFillColor({roundedColorRgba_.r, roundedColorRgba_.g, roundedColorRgba_.b, 255});
    target.draw(style_->dot_, states);

    target.draw(hueBar_, states);
    states.texture = &alphaTexture_;
    target.draw(alphaBar_, states);
    states.texture = nullptr;

    for (const auto& child : getChildren()) {
        target.draw(*child, states);
    }
}